

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portability_path.c
# Opt level: O2

size_t portability_path_get_directory
                 (char *path,size_t path_size,char *absolute,size_t absolute_size)

{
  char *pcVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (absolute != (char *)0x0 && path != (char *)0x0) {
    if (path_size < absolute_size) {
      absolute_size = path_size;
    }
    uVar3 = 0;
    uVar2 = 0;
    while ((uVar3 < absolute_size && (path[uVar3] != '\0'))) {
      absolute[uVar3] = path[uVar3];
      pcVar1 = path + uVar3;
      uVar3 = uVar3 + 1;
      if (*pcVar1 == '/') {
        uVar2 = uVar3;
      }
    }
    absolute[uVar2] = '\0';
    return uVar2 + 1;
  }
  return 0;
}

Assistant:

size_t portability_path_get_directory(const char *path, size_t path_size, char *absolute, size_t absolute_size)
{
	if (path == NULL || absolute == NULL)
	{
		return 0;
	}

	size_t i, last, size = path_size < absolute_size ? path_size : absolute_size;

	for (i = 0, last = 0; path[i] != '\0' && i < size; ++i)
	{
		absolute[i] = path[i];

		if (PORTABILITY_PATH_SEPARATOR(path[i]))
		{
			last = i + 1;
		}
	}

	absolute[last] = '\0';

	return last + 1;
}